

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int bucketSort(uint *begin,uint *end)

{
  uint uStack_445fc;
  byte abStack_445f8 [4];
  int i;
  bool bucket [280005];
  uint *puStack_20;
  int MAXID;
  uint *p;
  uint *end_local;
  uint *begin_local;
  
  memset(abStack_445f8,0,0x445c5);
  for (puStack_20 = begin; puStack_20 < end; puStack_20 = puStack_20 + 1) {
    abStack_445f8[*puStack_20] = 1;
  }
  puStack_20 = begin;
  for (uStack_445fc = 0; (int)uStack_445fc < 0x445c5; uStack_445fc = uStack_445fc + 1) {
    if ((abStack_445f8[(int)uStack_445fc] & 1) != 0) {
      *puStack_20 = uStack_445fc;
      puStack_20 = puStack_20 + 1;
    }
  }
  return (int)((long)puStack_20 - (long)begin >> 2);
}

Assistant:

int bucketSort(unsigned int *begin, const unsigned int *end) {
    unsigned int *p = begin;
    const int MAXID = maxSize;
    bool bucket[MAXID];
    memset(bucket, 0, sizeof(bucket));
    for (; p < end; ++p) {
        bucket[*p] = true;
    }
    p = begin;
    for (int i = 0; i < MAXID; i++) {
        if (bucket[i]) {
            *p = i;
            ++p;
        }
    }
    return p - begin;
}